

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerRestParameter
          (Lowerer *this,Opnd *formalsOpnd,Opnd *dstOpnd,Opnd *excessOpnd,Instr *instr,
          RegOpnd *generatorArgsPtrOpnd)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  Instr *instr_00;
  JITTimeFunctionBody *this_00;
  RegOpnd *dst;
  undefined4 *puVar4;
  IntConstOpnd *src2;
  LowererMD *this_01;
  long lVar5;
  RegOpnd *local_38;
  
  instr_00 = IR::Instr::New(CALL,dstOpnd,instr->m_func);
  IR::Instr::InsertAfter(instr,instr_00);
  LoadScriptContext(this,instr_00);
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsCoroutine(this_00);
  if (bVar2) {
    lVar5 = 0;
    local_38 = generatorArgsPtrOpnd;
  }
  else {
    local_38 = IR::Opnd::CreateFramePointerOpnd(this->m_func);
    lVar5 = 4;
  }
  dst = IR::RegOpnd::New(TyUint64,this->m_func);
  OVar3 = IR::Opnd::GetKind(formalsOpnd);
  if (OVar3 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  src2 = IR::IntConstOpnd::New
                   ((lVar5 + (long)formalsOpnd[1]._vptr_Opnd) * 8,TyUint64,this->m_func,false);
  InsertAdd(false,&dst->super_Opnd,&local_38->super_Opnd,&src2->super_Opnd,instr_00);
  this_01 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_01,instr_00,&dst->super_Opnd);
  LowererMD::LoadHelperArgument(this_01,instr_00,excessOpnd);
  LowererMD::ChangeToHelperCall
            (this_01,instr_00,HelperScrArr_OP_NewScArrayWithElements,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return instr_00;
}

Assistant:

IR::Instr *Lowerer::LowerRestParameter(IR::Opnd *formalsOpnd, IR::Opnd *dstOpnd, IR::Opnd *excessOpnd, IR::Instr *instr, IR::RegOpnd *generatorArgsPtrOpnd)
{
    IR::Instr * helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, dstOpnd, instr->m_func);
    instr->InsertAfter(helperCallInstr);

    // Var JavascriptArray::OP_NewScArrayWithElements(
    //        int32 elementCount,
    //        Var *elements,
    //        ScriptContext* scriptContext)
    IR::JnHelperMethod helperMethod = IR::HelperScrArr_OP_NewScArrayWithElements;

    LoadScriptContext(helperCallInstr);

    BOOL isGenerator = this->m_func->GetJITFunctionBody()->IsCoroutine();

    // Elements pointer = ebp + (formals count + formals offset + 1)*sizeof(Var)
    IR::RegOpnd *srcOpnd = isGenerator ? generatorArgsPtrOpnd : IR::Opnd::CreateFramePointerOpnd(this->m_func);
    uint16 actualOffset = isGenerator ? 0 : GetFormalParamOffset(); //4
    IR::RegOpnd *argPtrOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    InsertAdd(false, argPtrOpnd, srcOpnd, IR::IntConstOpnd::New((formalsOpnd->AsIntConstOpnd()->GetValue() + actualOffset) * MachPtr, TyMachPtr, this->m_func), helperCallInstr);
    m_lowererMD.LoadHelperArgument(helperCallInstr, argPtrOpnd);

    m_lowererMD.LoadHelperArgument(helperCallInstr, excessOpnd);
    m_lowererMD.ChangeToHelperCall(helperCallInstr, helperMethod);

    return helperCallInstr;
}